

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::EnsureLocalVarSlots(Func *this)

{
  code *pcVar1;
  bool bVar2;
  CodeGenWorkItemType CVar3;
  RegSlot RVar4;
  uint32 uVar5;
  int32 iVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *this_00;
  int *piVar8;
  int local_1c;
  int local_18;
  RegSlot local_14;
  int32 size;
  uint32 localSlotCount;
  Func *this_local;
  
  _size = this;
  bVar2 = IsJitInDebugMode(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x2eb,"(IsJitInDebugMode())","IsJitInDebugMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = HasLocalVarSlotCreated(this);
  if (!bVar2) {
    this_00 = GetJITFunctionBody(this);
    RVar4 = JITTimeFunctionBody::GetNonTempLocalVarCount(this_00);
    if ((RVar4 != 0) && (this->m_localVarSlotsOffset == -1)) {
      local_14 = RVar4;
      uVar5 = GetDiagLocalSlotSize();
      local_18 = RVar4 * uVar5;
      iVar6 = StackAllocate(this,local_18);
      this->m_localVarSlotsOffset = iVar6;
      local_1c = 1;
      piVar8 = max<int>(&local_1c,&MachStackAlignment);
      iVar6 = StackAllocate(this,*piVar8);
      this->m_hasLocalVarChangedOffset = iVar6;
      CVar3 = JITTimeWorkItem::Type(this->m_workItem);
      if (CVar3 != JsFunctionType) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x2f7,"(m_workItem->Type() == JsFunctionType)",
                           "m_workItem->Type() == JsFunctionType");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      iVar6 = AdjustOffsetValue(this->m_localVarSlotsOffset);
      JITOutput::SetVarSlotsOffset(&this->m_output,iVar6);
      iVar6 = AdjustOffsetValue(this->m_hasLocalVarChangedOffset);
      JITOutput::SetVarChangedOffset(&this->m_output,iVar6);
    }
  }
  return;
}

Assistant:

void
Func::EnsureLocalVarSlots()
{
    Assert(IsJitInDebugMode());

    if (!this->HasLocalVarSlotCreated())
    {
        uint32 localSlotCount = GetJITFunctionBody()->GetNonTempLocalVarCount();
        if (localSlotCount && m_localVarSlotsOffset == Js::Constants::InvalidOffset)
        {
            // Allocate the slots.
            int32 size = localSlotCount * GetDiagLocalSlotSize();
            m_localVarSlotsOffset = StackAllocate(size);
            m_hasLocalVarChangedOffset = StackAllocate(max(1, MachStackAlignment)); // Can't alloc less than StackAlignment bytes.

            Assert(m_workItem->Type() == JsFunctionType);

            m_output.SetVarSlotsOffset(AdjustOffsetValue(m_localVarSlotsOffset));
            m_output.SetVarChangedOffset(AdjustOffsetValue(m_hasLocalVarChangedOffset));
        }
    }
}